

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O2

void wallet::walletload_tests::wallet_load_ckey_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_6e0;
  pointer local_6d8;
  char *local_6d0;
  char *local_6c8;
  pointer local_6c0;
  pointer local_6b8;
  char *local_6b0;
  char *local_6a8;
  pointer local_6a0;
  pointer local_698;
  char *local_690;
  char *local_688;
  pointer local_680;
  pointer local_678;
  char *local_670;
  char *local_668;
  pointer local_660;
  pointer local_658;
  char *local_650;
  char *local_648;
  basic_wrap_stringstream<char> local_640;
  wallet_load_ckey t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_648 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"wallet_load_ckey");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_660 = (pbVar3->_M_dataplus)._M_p;
  local_658 = local_660 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x72;
  file.m_begin = (iterator)&local_650;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_660,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  wallet_load_ckey::wallet_load_ckey(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_668 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"wallet_load_ckey");
  std::operator<<((ostream *)&local_640,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_680 = (pbVar3->_M_dataplus)._M_p;
  local_678 = local_680 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x72;
  file_00.m_begin = (iterator)&local_670;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_680,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_688 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"wallet_load_ckey");
  std::operator<<((ostream *)&local_640,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6a0 = (pbVar3->_M_dataplus)._M_p;
  local_698 = local_6a0 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x72;
  file_01.m_begin = (iterator)&local_690;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6a0,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  wallet_load_ckey::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_6a8 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"wallet_load_ckey");
  std::operator<<((ostream *)&local_640,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6c0 = (pbVar3->_M_dataplus)._M_p;
  local_6b8 = local_6c0 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x72;
  file_02.m_begin = (iterator)&local_6b0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6c0,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_6c8 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"wallet_load_ckey");
  std::operator<<((ostream *)&local_640,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6e0 = (pbVar3->_M_dataplus)._M_p;
  local_6d8 = local_6e0 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x72;
  file_03.m_begin = (iterator)&local_6d0;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6e0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_load_ckey, TestingSetup)
{
    SerializeData ckey_record_key;
    SerializeData ckey_record_value;
    MockableData records;

    {
        // Context setup.
        // Create and encrypt legacy wallet
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase()));
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));

        // Retrieve a key
        CTxDestination dest = *Assert(legacy_spkm->GetNewDestination(OutputType::LEGACY));
        CKeyID key_id = GetKeyForDestination(*legacy_spkm, dest);
        CKey first_key;
        BOOST_CHECK(legacy_spkm->GetKey(key_id, first_key));

        // Encrypt the wallet
        BOOST_CHECK(wallet->EncryptWallet("encrypt"));
        wallet->Flush();

        // Store a copy of all the records
        records = GetMockableDatabase(*wallet).m_records;

        // Get the record for the retrieved key
        ckey_record_key = MakeSerializeData(DBKeys::CRYPTED_KEY, first_key.GetPubKey());
        ckey_record_value = records.at(ckey_record_key);
    }

    {
        // First test case:
        // Erase all the crypted keys from db and unlock the wallet.
        // The wallet will only re-write the crypted keys to db if any checksum is missing at load time.
        // So, if any 'ckey' record re-appears on db, then the checksums were not properly calculated, and we are re-writing
        // the records every time that 'CWallet::Unlock' gets called, which is not good.

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all records and check that the 'Unlock' function doesn't re-write them
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Second test case:
        // Verify that loading up a 'ckey' with no checksum triggers a complete re-write of the crypted keys.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all ckey records and check that the 'Unlock' function re-writes them
        // (this is because the wallet, at load time, found a ckey record with no checksum)
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Third test case:
        // Verify that loading up a 'ckey' with an invalid checksum throws an error.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);
        // Fill in the checksum space with 0s
        records[ckey_record_key].resize(ckey_record_value.size());

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }

    {
        // Fourth test case:
        // Verify that loading up a 'ckey' with an invalid pubkey throws an error
        CPubKey invalid_key;
        BOOST_CHECK(!invalid_key.IsValid());
        SerializeData key = MakeSerializeData(DBKeys::CRYPTED_KEY, invalid_key);
        records[key] = ckey_record_value;

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }
}